

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

int lj_opt_fwd_wasnonnil(jit_State *J,IROpT loadop,IRRef xref)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  bool bVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  uint uVar7;
  uint in_R9D;
  ulong uVar8;
  
  uVar7 = (uint)J->chain[(CONCAT62(in_register_00000032,loadop) & 0xffffffff) + 8];
  do {
    if (uVar7 <= xref) {
      uVar2 = J->chain[loadop];
      while( true ) {
        if (uVar2 <= xref) {
          return 0;
        }
        pIVar4 = (J->cur).ir;
        uVar8 = (ulong)(uint)uVar2;
        if (pIVar4[uVar8].field_0.op1 == xref) break;
        uVar2 = *(ushort *)((long)pIVar4 + uVar8 * 8 + 6);
      }
      return (uint)((*(byte *)((long)pIVar4 + uVar8 * 8 + 4) & 0x1f) != 0);
    }
    pIVar4 = (J->cur).ir;
    uVar8 = (ulong)uVar7;
    bVar1 = *(byte *)((long)pIVar4 + uVar8 * 8 + 4);
    if (pIVar4[uVar8].field_0.op1 == xref) {
      uVar6 = (uint)((bVar1 & 0x1f) != 0);
LAB_0011dc35:
      bVar5 = false;
      in_R9D = uVar6;
    }
    else {
      if ((bVar1 & 0x1f) == 0) {
        uVar2 = *(ushort *)((long)pIVar4 + (ulong)pIVar4[uVar8].field_0.op1 * 8 + 2);
        uVar3 = *(ushort *)((long)pIVar4 + (ulong)xref * 8 + 2);
        if ((loadop == 0x42) ||
           (((*(byte *)((long)pIVar4 + (ulong)uVar3 * 8 + 4) ^
             *(byte *)((long)pIVar4 + (ulong)uVar2 * 8 + 4)) & 0x1f) == 0)) {
          bVar5 = false;
          if (uVar2 == uVar3) {
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            if (-1 < (short)(uVar2 | uVar3)) goto LAB_0011dc79;
          }
        }
        else {
LAB_0011dc79:
          bVar5 = true;
          uVar6 = in_R9D;
        }
        in_R9D = uVar6;
        if (!bVar5) goto LAB_0011dc35;
      }
      uVar7 = (uint)*(ushort *)((long)pIVar4 + uVar8 * 8 + 6);
      bVar5 = true;
    }
    if (!bVar5) {
      return in_R9D;
    }
  } while( true );
}

Assistant:

int lj_opt_fwd_wasnonnil(jit_State *J, IROpT loadop, IRRef xref)
{
  /* First check stores. */
  IRRef ref = J->chain[loadop+IRDELTA_L2S];
  while (ref > xref) {
    IRIns *store = IR(ref);
    if (store->op1 == xref) {  /* Same xREF. */
      /* A nil store MAY alias, but a non-nil store MUST alias. */
      return !irt_isnil(store->t);
    } else if (irt_isnil(store->t)) {  /* Must check any nil store. */
      IRRef skref = IR(store->op1)->op2;
      IRRef xkref = IR(xref)->op2;
      /* Same key type MAY alias. Need ALOAD check due to multiple int types. */
      if (loadop == IR_ALOAD || irt_sametype(IR(skref)->t, IR(xkref)->t)) {
	if (skref == xkref || !irref_isk(skref) || !irref_isk(xkref))
	  return 0;  /* A nil store with same const key or var key MAY alias. */
	/* Different const keys CANNOT alias. */
      }  /* Different key types CANNOT alias. */
    }  /* Other non-nil stores MAY alias. */
    ref = store->prev;
  }

  /* Check loads since nothing could be derived from stores. */
  ref = J->chain[loadop];
  while (ref > xref) {
    IRIns *load = IR(ref);
    if (load->op1 == xref) {  /* Same xREF. */
      /* A nil load MAY alias, but a non-nil load MUST alias. */
      return !irt_isnil(load->t);
    }  /* Other non-nil loads MAY alias. */
    ref = load->prev;
  }
  return 0;  /* Nothing derived at all, previous value MAY be nil. */
}